

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  int iVar1;
  appender aVar2;
  size_t in_RCX;
  undefined4 in_EDX;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_RSI;
  size_t in_R8;
  uint size;
  char digits [40];
  int num_digits;
  undefined8 in_stack_ffffffffffffff60;
  int size_00;
  unsigned_long in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int num_digits_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  num_digits_00 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  size_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  iVar1 = count_digits(0x22328b);
  format_decimal<char,unsigned_long>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,size_00);
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             num_digits_00);
  to_unsigned<int>(0);
  aVar2 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)in_RSI.container,
                     (format_specs<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,in_R8,
                     (anon_class_32_4_dca7119b *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) {
          char sign = static_cast<char>(prefix);
          *it++ = static_cast<Char>(sign);
        }
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}